

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O0

void __thiscall fs_tests::fsbridge_fstream::test_method(fsbridge_fstream *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe9f8;
  char *in_stack_ffffffffffffea00;
  char *in_stack_ffffffffffffea08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea10;
  const_string *in_stack_ffffffffffffea20;
  lazy_ostream *in_stack_ffffffffffffea28;
  string *in_stack_ffffffffffffea30;
  const_string *file_00;
  undefined7 in_stack_ffffffffffffea38;
  undefined1 in_stack_ffffffffffffea3f;
  char *in_stack_ffffffffffffea40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea48;
  string *psVar3;
  fsbridge_fstream *this_local;
  undefined1 local_1498 [16];
  undefined1 local_1488 [24];
  undefined1 local_1448 [16];
  undefined1 local_1438 [64];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [64];
  const_string local_13a8 [2];
  lazy_ostream local_1388 [2];
  assertion_result local_1368 [2];
  undefined1 local_1330 [16];
  undefined1 local_1320 [64];
  const_string local_12e0 [2];
  lazy_ostream local_12c0 [2];
  assertion_result local_12a0 [2];
  allocator<char> local_1261;
  undefined1 local_1260 [16];
  undefined1 local_1250 [64];
  undefined1 local_1210 [16];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [64];
  undefined1 local_1170 [16];
  undefined1 local_1160 [71];
  allocator<char> local_1119;
  const_string local_1118;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined1 local_10f0 [120];
  path p_1;
  path p;
  string input_buffer_3;
  ifstream file_6;
  ofstream file_5;
  string input_buffer_2;
  ifstream file_4;
  ofstream file_3;
  string input_buffer_1;
  ifstream file_2;
  string input_buffer;
  ifstream file_1;
  ofstream file;
  path tmpfile2;
  path tmpfile1;
  path tmpfolder;
  
  p.super_path._M_pathname._M_string_length = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((ArgsManager *)in_stack_ffffffffffffea00);
  fs::path::path((path *)in_stack_ffffffffffffe9f8,(path *)0x66f11c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38));
  fs::u8path(in_stack_ffffffffffffea30);
  fs::operator/((path *)in_stack_ffffffffffffea10,(path *)in_stack_ffffffffffffea08);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9f8);
  std::allocator<char>::~allocator(&local_1119);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  fs::path::path((path *)in_stack_ffffffffffffe9f8,(path *)0x66f1d0);
  fs::path::path<char8_t[18],std::filesystem::__cxx11::path>
            ((path *)in_stack_ffffffffffffea08,(char8_t (*) [18])in_stack_ffffffffffffea00,
             (format)((ulong)in_stack_ffffffffffffe9f8 >> 0x38));
  fs::operator/((path *)in_stack_ffffffffffffea10,(path *)in_stack_ffffffffffffea08);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  std::ofstream::ofstream<fs::path,fs::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffea08,
             (path *)in_stack_ffffffffffffea00,(openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20))
  ;
  std::operator<<((ostream *)&file,"bitcoin");
  std::ofstream::~ofstream(&file);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffea08,
             (path *)in_stack_ffffffffffffea00,(openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20))
  ;
  std::__cxx11::string::string(in_stack_ffffffffffffea10);
  std::operator>>((istream *)&file_1,(string *)&input_buffer);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffea08 = "\"bitcoin\"";
    in_stack_ffffffffffffea00 = "bitcoin";
    in_stack_ffffffffffffe9f8 = "input_buffer";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_1160,local_1170,0x3d,1,2,&input_buffer);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9f8);
  std::ifstream::~ifstream(&file_1);
  std::operator|((_Ios_Openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20),
                 (_Ios_Openmode)in_stack_ffffffffffffe9f8);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffea08,
             (path *)in_stack_ffffffffffffea00,(openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20))
  ;
  psVar3 = &input_buffer_1;
  std::__cxx11::string::string(in_stack_ffffffffffffea10);
  std::operator>>((istream *)&file_2,(string *)psVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffea08 = "\"\"";
    in_stack_ffffffffffffea00 = "";
    in_stack_ffffffffffffe9f8 = "input_buffer";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_11b0,local_11c0,0x43,1,2,&input_buffer_1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9f8);
  std::ifstream::~ifstream(&file_2);
  std::operator|((_Ios_Openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20),
                 (_Ios_Openmode)in_stack_ffffffffffffe9f8);
  std::ofstream::ofstream<fs::path,fs::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffea08,
             (path *)in_stack_ffffffffffffea00,(openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20))
  ;
  std::operator<<((ostream *)&file_3,"tests");
  std::ofstream::~ofstream(&file_3);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffea08,
             (path *)in_stack_ffffffffffffea00,(openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20))
  ;
  std::__cxx11::string::string(in_stack_ffffffffffffea10);
  std::operator>>((istream *)&file_4,(string *)&input_buffer_2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffea08 = "\"bitcointests\"";
    in_stack_ffffffffffffea00 = "bitcointests";
    in_stack_ffffffffffffe9f8 = "input_buffer";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (local_1200,local_1210,0x4d,1,2,&input_buffer_2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9f8);
  std::ifstream::~ifstream(&file_4);
  std::operator|((_Ios_Openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20),
                 (_Ios_Openmode)in_stack_ffffffffffffe9f8);
  std::ofstream::ofstream<fs::path,fs::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffea08,
             (path *)in_stack_ffffffffffffea00,(openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20))
  ;
  std::operator<<((ostream *)&file_5,"bitcoin");
  std::ofstream::~ofstream(&file_5);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffea08,
             (path *)in_stack_ffffffffffffea00,(openmode)((ulong)in_stack_ffffffffffffe9f8 >> 0x20))
  ;
  std::__cxx11::string::string(in_stack_ffffffffffffea10);
  std::operator>>((istream *)&file_6,(string *)&input_buffer_3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffea08 = "\"bitcoin\"";
    in_stack_ffffffffffffea00 = "bitcoin";
    in_stack_ffffffffffffe9f8 = "input_buffer";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_1250,local_1260,0x57,1,2,&input_buffer_3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9f8);
  std::ifstream::~ifstream(&file_6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38));
  fs::u8path(in_stack_ffffffffffffea30);
  fsbridge::AbsPathJoin
            ((path *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
             (path *)in_stack_ffffffffffffea30);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe9f8);
  std::allocator<char>::~allocator(&local_1261);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    std::filesystem::__cxx11::path::is_absolute((path *)in_stack_ffffffffffffe9f8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea08,
               SUB81((ulong)in_stack_ffffffffffffea00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffe9f8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_12a0,local_12c0,local_12e0,0x5c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe9f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffea08 = "p";
    in_stack_ffffffffffffea00 = (char *)&p;
    in_stack_ffffffffffffe9f8 = "tmpfile1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1320,local_1330,0x5d,1,2,&tmpfile1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  fsbridge::AbsPathJoin
            ((path *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
             (path *)in_stack_ffffffffffffea30);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    std::filesystem::__cxx11::path::is_absolute((path *)in_stack_ffffffffffffe9f8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea08,
               SUB81((ulong)in_stack_ffffffffffffea00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffe9f8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1368,local_1388,local_13a8,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe9f8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffea08 = "p";
    in_stack_ffffffffffffea00 = (char *)&p_1;
    in_stack_ffffffffffffe9f8 = "tmpfile2";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_13e8,local_13f8,99,1,2,&tmpfile2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (const_string *)in_stack_ffffffffffffea30,(size_t)in_stack_ffffffffffffea28,
               in_stack_ffffffffffffea20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    fs::path::path((path *)0x66ff99,in_stack_ffffffffffffe9f8);
    fsbridge::AbsPathJoin
              ((path *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               (path *)in_stack_ffffffffffffea30);
    in_stack_ffffffffffffea08 = "fsbridge::AbsPathJoin(tmpfile1, \"\")";
    in_stack_ffffffffffffea00 = local_10f0 + 0x50;
    in_stack_ffffffffffffe9f8 = "tmpfile1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1438,local_1448,0x67,1,2,&tmpfile1);
    fs::path::~path((path *)in_stack_ffffffffffffe9f8);
    fs::path::~path((path *)in_stack_ffffffffffffe9f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    in_stack_ffffffffffffea3f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffea3f);
  do {
    file_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),
               file_00,(size_t)in_stack_ffffffffffffea28,in_stack_ffffffffffffea20);
    in_stack_ffffffffffffea28 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffea00,(char (*) [1])in_stack_ffffffffffffe9f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea08,in_stack_ffffffffffffea00,
               (unsigned_long)in_stack_ffffffffffffe9f8);
    local_1108 = 0;
    uStack_1100 = 0;
    local_1118.m_begin = (iterator)0x0;
    local_1118.m_end = (iterator)0x0;
    local_10f8 = 0;
    in_stack_ffffffffffffea20 = &local_1118;
    fs::path::path((path *)in_stack_ffffffffffffe9f8);
    fsbridge::AbsPathJoin
              ((path *)CONCAT17(in_stack_ffffffffffffea3f,in_stack_ffffffffffffea38),(path *)file_00
              );
    in_stack_ffffffffffffea08 = "fsbridge::AbsPathJoin(tmpfile1, {})";
    in_stack_ffffffffffffea00 = local_10f0;
    in_stack_ffffffffffffe9f8 = "tmpfile1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1488,local_1498,0x68,1,2,&tmpfile1);
    fs::path::~path((path *)in_stack_ffffffffffffe9f8);
    fs::path::~path((path *)in_stack_ffffffffffffe9f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  fs::path::~path((path *)in_stack_ffffffffffffe9f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_fstream)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    // tmpfile1 should be the same as tmpfile2
    fs::path tmpfile1 = tmpfolder / fs::u8path("fs_tests_₿_🏃");
    fs::path tmpfile2 = tmpfolder / fs::path(u8"fs_tests_₿_🏃");
    {
        std::ofstream file{tmpfile1};
        file << "bitcoin";
    }
    {
        std::ifstream file{tmpfile2};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcoin");
    }
    {
        std::ifstream file{tmpfile1, std::ios_base::in | std::ios_base::ate};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "");
    }
    {
        std::ofstream file{tmpfile2, std::ios_base::out | std::ios_base::app};
        file << "tests";
    }
    {
        std::ifstream file{tmpfile1};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcointests");
    }
    {
        std::ofstream file{tmpfile2, std::ios_base::out | std::ios_base::trunc};
        file << "bitcoin";
    }
    {
        std::ifstream file{tmpfile1};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcoin");
    }
    {
        // Join an absolute path and a relative path.
        fs::path p = fsbridge::AbsPathJoin(tmpfolder, fs::u8path("fs_tests_₿_🏃"));
        BOOST_CHECK(p.is_absolute());
        BOOST_CHECK_EQUAL(tmpfile1, p);
    }
    {
        // Join two absolute paths.
        fs::path p = fsbridge::AbsPathJoin(tmpfile1, tmpfile2);
        BOOST_CHECK(p.is_absolute());
        BOOST_CHECK_EQUAL(tmpfile2, p);
    }
    {
        // Ensure joining with empty paths does not add trailing path components.
        BOOST_CHECK_EQUAL(tmpfile1, fsbridge::AbsPathJoin(tmpfile1, ""));
        BOOST_CHECK_EQUAL(tmpfile1, fsbridge::AbsPathJoin(tmpfile1, {}));
    }
}